

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall cmCTestRunTest::NeedsToRerun(cmCTestRunTest *this)

{
  cmCTestRunTest *this_local;
  
  this->NumberOfRunsLeft = this->NumberOfRunsLeft + -1;
  if (this->NumberOfRunsLeft == 0) {
    this_local._7_1_ = false;
  }
  else if (((this->RunUntilFail & 1U) == 0) || ((this->TestResult).Status != 9)) {
    this_local._7_1_ = false;
  }
  else {
    this->RunAgain = true;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestRunTest::NeedsToRerun()
{
  this->NumberOfRunsLeft--;
  if (this->NumberOfRunsLeft == 0) {
    return false;
  }
  // if number of runs left is not 0, and we are running until
  // we find a failed test, then return true so the test can be
  // restarted
  if (this->RunUntilFail &&
      this->TestResult.Status == cmCTestTestHandler::COMPLETED) {
    this->RunAgain = true;
    return true;
  }
  return false;
}